

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O2

int lnsrchcg(custom_function *funcpt,custom_gradient *funcgrad,double *xi,double *jac,double *p,
            int N,double *dx,double maxstep,double eps2,double stol,double *x,double *jacf)

{
  double dVar1;
  int iVar2;
  double *C;
  double *C_00;
  double *A;
  double *B;
  double *C_01;
  double *array;
  double *B_00;
  ulong uVar3;
  double *pdVar4;
  char *__format;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  uint uVar16;
  double dVar17;
  double dVar18;
  double local_138;
  undefined8 local_e8;
  double local_d8;
  double local_88;
  double local_48;
  
  C = (double *)malloc(8);
  C_00 = (double *)malloc(8);
  A = (double *)malloc(0x20);
  B = (double *)malloc(0x10);
  C_01 = (double *)malloc(0x10);
  array = (double *)malloc((long)N * 8);
  B_00 = (double *)malloc((long)N * 8);
  uVar3 = 0;
  uVar6 = 0;
  if (0 < N) {
    uVar6 = (ulong)(uint)N;
  }
  dVar7 = 0.0;
  for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    dVar7 = dVar7 + dx[uVar3] * p[uVar3] * dx[uVar3] * p[uVar3];
  }
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  if (maxstep < dVar7) {
    scale(p,1,N,maxstep / dVar7);
    dVar7 = maxstep;
  }
  mmult(jac,p,C,1,N,1);
  for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    dVar8 = ABS(xi[uVar3]);
    if (ABS(xi[uVar3]) <= 1.0 / ABS(dx[uVar3])) {
      dVar8 = 1.0 / ABS(dx[uVar3]);
    }
    array[uVar3] = p[uVar3] / dVar8;
  }
  dVar8 = array_max_abs(array,N);
  dVar9 = (*funcpt->funcpt)(xi,N,funcpt->params);
  if (1.79769313486232e+308 <= ABS(dVar9)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    return 0xf;
  }
  if (!NAN(dVar9)) {
    dVar10 = maxstep / dVar7;
    uVar5 = 100;
    local_d8 = 1.0;
    local_e8 = 1.0;
    dVar12 = 1.0;
LAB_00123390:
    do {
      dVar13 = dVar12;
      do {
        while( true ) {
          if (uVar5 < 2) {
            free(C);
            free(A);
            free(B);
            free(C_01);
            free(array);
            free(B_00);
            free(C_00);
            return uVar5;
          }
          for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
            B_00[uVar3] = p[uVar3] * dVar13;
          }
          madd(xi,B_00,x,1,N);
          dVar11 = (*funcpt->funcpt)(x,N,funcpt->params);
          if (1.79769313486232e+308 <= ABS(dVar11)) goto LAB_00123c6b;
          if (NAN(dVar11)) goto LAB_00123c74;
          dVar12 = *C;
          if (dVar11 <= dVar13 * 0.0001 * dVar12 + dVar9) break;
          if (stol / dVar8 <= dVar13) {
            if ((dVar13 != 1.0) || (NAN(dVar13))) {
              *A = 1.0 / (dVar13 * dVar13);
              A[1] = -1.0 / (local_e8 * local_e8);
              A[2] = -local_e8 / (dVar13 * dVar13);
              A[3] = dVar13 / (local_e8 * local_e8);
              *B = (dVar11 - dVar9) - dVar13 * dVar12;
              B[1] = (local_d8 - dVar9) - local_e8 * dVar12;
              mmult(A,B,C_01,2,2,1);
              scale(C_01,1,2,1.0 / (dVar13 - local_e8));
              dVar12 = *C_01;
              if ((dVar12 != 0.0) || (NAN(dVar12))) {
                dVar17 = C_01[1];
                dVar12 = dVar17 * dVar17 + dVar12 * -3.0 * *C;
                if (dVar12 < 0.0) {
                  dVar12 = sqrt(dVar12);
                }
                else {
                  dVar12 = SQRT(dVar12);
                }
                dVar12 = dVar12 - dVar17;
                uVar16 = 0x40080000;
                pdVar4 = C_01;
              }
              else {
                dVar12 = -*C;
                uVar16 = 0x40000000;
                pdVar4 = C_01 + 1;
              }
              dVar12 = dVar12 / ((double)((ulong)uVar16 << 0x20) * *pdVar4);
              if (dVar13 * 0.5 < dVar12) {
                dVar12 = dVar13 * 0.5;
              }
            }
            else {
              dVar17 = (dVar11 - dVar9) - dVar12;
              dVar12 = -dVar12 / (dVar17 + dVar17);
            }
            uVar3 = -(ulong)(dVar12 <= dVar13 * 0.1);
            dVar12 = (double)(~uVar3 & (ulong)dVar12 | (ulong)(dVar13 * 0.1) & uVar3);
            local_e8 = dVar13;
            local_d8 = dVar11;
            goto LAB_00123390;
          }
          for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
            x[uVar3] = xi[uVar3];
          }
          uVar5 = 1;
        }
        iVar2 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
        if (iVar2 == 0xf) {
          return 0xf;
        }
        mmult(jacf,p,C_00,1,N,1);
        dVar12 = *C_00;
        uVar14 = SUB84(dVar12,0);
        uVar15 = (undefined4)((ulong)dVar12 >> 0x20);
        dVar17 = *C;
        uVar5 = 0;
      } while (ABS(dVar12) < dVar17 * -0.9);
      if (((dVar7 < maxstep) && (dVar13 == 1.0)) && (!NAN(dVar13))) {
        dVar12 = dVar11;
        dVar13 = 1.0;
LAB_001235b1:
        dVar11 = dVar12;
        if (dVar13 * 0.0001 * dVar17 + dVar9 < dVar11) {
          dVar12 = *C_00;
          uVar14 = SUB84(dVar12,0);
          uVar15 = (undefined4)((ulong)dVar12 >> 0x20);
          if ((ABS(dVar12) < dVar17 * -0.9) && (dVar10 <= dVar13)) goto LAB_001238f5;
        }
        dVar18 = dVar13 + dVar13;
        if (dVar10 <= dVar13 + dVar13) {
          dVar18 = dVar10;
        }
        for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
          B_00[uVar3] = p[uVar3] * dVar18;
        }
        madd(xi,B_00,x,1,N);
        dVar12 = (*funcpt->funcpt)(x,N,funcpt->params);
        if (1.79769313486232e+308 <= ABS(dVar12)) goto LAB_00123c6b;
        if (NAN(dVar12)) break;
        dVar17 = *C;
        local_e8._0_4_ = SUB84(dVar13,0);
        local_e8._4_4_ = (undefined4)((ulong)dVar13 >> 0x20);
        local_d8 = dVar11;
        dVar13 = dVar18;
        if (dVar12 <= dVar18 * 0.0001 * dVar17 + dVar9) {
          iVar2 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
          if (iVar2 == 0xf) {
            return 0xf;
          }
          mmult(jacf,p,C_00,1,N,1);
          dVar17 = *C;
        }
        goto LAB_001235b1;
      }
LAB_001238f5:
      if ((dVar13 < 1.0) ||
         ((uVar5 = 0, dVar12 = dVar13, 1.0 < dVar13 && (dVar13 * 0.0001 * dVar17 + dVar9 < dVar11)))
         ) {
        local_88 = dVar13;
        local_48 = local_d8;
        if (local_e8 <= dVar13) {
          local_88 = local_e8;
          local_48 = dVar11;
        }
        dVar18 = ABS(local_e8 - dVar13);
        local_138 = (double)(~-(ulong)(dVar13 < local_e8) & (ulong)local_d8 |
                            (ulong)dVar11 & -(ulong)(dVar13 < local_e8));
LAB_00123973:
        do {
          do {
            if ((ABS((double)CONCAT44(uVar15,uVar14)) < dVar17 * -0.9) &&
               (uVar5 = 0, dVar12 = dVar13, dVar18 <= stol / dVar8)) goto LAB_00123390;
            dVar12 = local_48 - ((double)CONCAT44(uVar15,uVar14) * dVar18 + local_138);
            dVar13 = (-(double)CONCAT44(uVar15,uVar14) * dVar18 * dVar18) / (dVar12 + dVar12);
            dVar12 = dVar18 * 0.2;
            if (dVar18 * 0.2 <= dVar13) {
              dVar12 = dVar13;
            }
            dVar13 = local_88 + dVar12;
            for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
              B_00[uVar3] = p[uVar3] * dVar13;
            }
            madd(xi,B_00,x,1,N);
            dVar11 = (*funcpt->funcpt)(x,N,funcpt->params);
            if (1.79769313486232e+308 <= ABS(dVar11)) goto LAB_00123c6b;
            if (NAN(dVar11)) goto LAB_00123c74;
            dVar17 = *C;
            if (dVar13 * 0.0001 * dVar17 + dVar9 < dVar11) {
              uVar14 = SUB84(*C_00,0);
              uVar15 = (undefined4)((ulong)*C_00 >> 0x20);
              dVar18 = dVar12;
              local_48 = dVar11;
              goto LAB_00123973;
            }
            iVar2 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
            if (iVar2 == 0xf) {
              return 0xf;
            }
            mmult(jacf,p,C_00,1,N,1);
            dVar1 = *C_00;
            uVar14 = SUB84(dVar1,0);
            uVar15 = (undefined4)((ulong)dVar1 >> 0x20);
            dVar17 = *C;
          } while (ABS(dVar1) < dVar17 * -0.9);
          dVar18 = dVar18 - dVar12;
          local_138 = dVar11;
          local_88 = dVar13;
        } while( true );
      }
    } while( true );
  }
LAB_00123c74:
  __format = "Program Exiting as the function returns NaN";
LAB_00123c7b:
  printf(__format);
  return 0xf;
LAB_00123c6b:
  __format = "Program Exiting as the function value exceeds the maximum double value";
  goto LAB_00123c7b;
}

Assistant:

int lnsrchcg(custom_function *funcpt, custom_gradient *funcgrad, double *xi, double *jac, double *p, int N, double * dx, double maxstep,
	double eps2,double stol,double *x,double *jacf) {
	int retval,i,gfdcode;
	double alpha,lambda,lambdamin,funcf,funci,lambdaprev,lambdatemp,funcprev;
	double lambda2,lambdaprev2,ll,den,rell,nlen;
	double *slopei,*temp1,*temp2,*ab,*rcheck,*pl;
	double *slopen;
	double beta,lambdamax,lambdalo,lambdainc,lambdadiff,funclo,funchi;
	
	slopei = (double*) malloc(sizeof(double) *1);
	slopen = (double*) malloc(sizeof(double) *1);
	temp1 = (double*) malloc(sizeof(double) *4);
	temp2 = (double*) malloc(sizeof(double) *2);
	ab = (double*) malloc(sizeof(double) *2);
	rcheck = (double*) malloc(sizeof(double) *N);
	pl = (double*) malloc(sizeof(double) *N);
	retval = 100;
	alpha = 1e-04;
	lambda = 1.0;
	nlen = 0.0;
	beta = 0.9;
	gfdcode = 0;
	funcprev = 1.0; // funcprev and lambdaprev are initialized to suppress warnings
	lambdaprev = 1.0; // These values are not used as the program sets the value later on.
	
	for(i = 0; i < N;++i) {
		nlen += dx[i] * p[i] * dx[i] * p[i];
	}
	nlen = sqrt(nlen);
	
	if (nlen > maxstep) {
		scale(p,1,N,maxstep/nlen);
		nlen = maxstep;
	}
	
	mmult(jac,p,slopei,1,N,1);
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 /fabs(dx[i])) {
			den = fabs(xi[i]);
		} else {
			den = 1.0 /fabs(dx[i]);
		}
		rcheck[i] = p[i]/den;
	}
	
	rell = array_max_abs(rcheck,N);
	
	lambdamin = stol/rell;
	
	funci = FUNCPT_EVAL(funcpt, xi, N);
	
	if (funci >= DBL_MAX || funci <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		return 15;
	}
	if (funci != funci) {
		printf("Program Exiting as the function returns NaN");
		return 15;
	}
	while (retval > 1) {
		for(i = 0; i < N;++i) {
			pl[i] = p[i] * lambda;
		}
		madd(xi,pl,x,1,N);
		funcf = FUNCPT_EVAL(funcpt, x, N);
		if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			return 15;
		}
		if (funcf != funcf) {
			printf("Program Exiting as the function returns NaN");
			return 15;
		}
		if (funcf <= funci + alpha *lambda *slopei[0]) {
			gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
			if (gfdcode == 15) {
				return 15;
			}
			mmult(jacf,p,slopen,1,N,1);
			if(fabs(slopen[0]) >= - beta * slopei[0]) {
					if (lambda == 1.0 && nlen < maxstep) {
						lambdamax = maxstep / nlen;
						while (funcf <= funci + alpha *lambda *slopei[0] || fabs(slopen[0]) >= -beta * slopei[0] || lambda < lambdamax) {
							lambdaprev = lambda;
							funcprev = funcf;
							if ( 2*lambda < lambdamax) {
								lambda = 2*lambda;
							} else {
								lambda = lambdamax;
							}
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambda;
							}
							madd(xi,pl,x,1,N);
							funcf = FUNCPT_EVAL(funcpt, x, N);
							if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
								printf("Program Exiting as the function value exceeds the maximum double value");
								return 15;
							}
							if (funcf != funcf) {
								printf("Program Exiting as the function returns NaN");
								return 15;
							}
							if (funcf <= funci + alpha *lambda *slopei[0]) {
								gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
								if (gfdcode == 15) {
									return 15;
								}
								mmult(jacf,p,slopen,1,N,1);
							}
						}
					}
					if (lambda < 1.0 || (lambda > 1.0 && funcf > funci + alpha *lambda *slopei[0])) {
						if (lambda < lambdaprev) {
							lambdalo = lambda; 
						} else {
							lambdalo = lambdaprev; 
						}
						lambdadiff = fabs(lambdaprev - lambda);
						
						if (lambda < lambdaprev) {
							funclo = funcf;
							funchi = funcprev;
						} else {
							funchi = funcf;
							funclo = funcprev;
						}
						while (fabs(slopen[0]) >= -beta * slopei[0] || lambdadiff > lambdamin) {
							lambdainc = -slopen[0] * lambdadiff * lambdadiff / (2.0 * (funchi - (funclo + slopen[0] *lambdadiff)));
							if ( lambdainc < 0.2 * lambdadiff) {
								lambdainc = 0.2 * lambdadiff;
							}
							lambda = lambdalo + lambdainc;
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambda;
							}
							madd(xi,pl,x,1,N);
							funcf = FUNCPT_EVAL(funcpt, x, N);
							if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
								printf("Program Exiting as the function value exceeds the maximum double value");
								return 15;
							}
							if (funcf != funcf) {
								printf("Program Exiting as the function returns NaN");
								return 15;
							}
							if (funcf > funci + alpha *lambda *slopei[0]) {
								lambdadiff = lambdainc;
								funchi = funcf;
							} else {
								gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
								if (gfdcode == 15) {
									return 15;
								}
								mmult(jacf,p,slopen,1,N,1);
								if (fabs(slopen[0]) >= -beta * slopei[0]) {
									lambdalo = lambda;
									lambdadiff -= lambdainc;
									funclo = funcf;
								}
							}
						}
						if (fabs(slopen[0]) >= -beta * slopei[0]) {
							funcf = funclo;
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambdalo;
							}
							madd(xi,pl,x,1,N);
						}
					}
						
			}
			
			retval = 0;
		} else if (lambda < lambdamin) {
			retval = 1;
			for (i = 0; i < N;++i) {
				x[i] = xi[i]; // Check
			}
		} else {
			if (lambda == 1.0) {
				lambdatemp = - slopei[0] / (2.0 * (funcf - funci - slopei[0])); 
			} else {
				
				lambda2 = lambda * lambda;
				lambdaprev2 = lambdaprev * lambdaprev;
				ll = lambda - lambdaprev;
				temp1[0] = 1.0 / lambda2; temp1[1] = -1.0 /lambdaprev2;
				temp1[2] = - lambdaprev / lambda2; temp1[3] = lambda /lambdaprev2;
				temp2[0] = funcf - funci - lambda * slopei[0];
				temp2[1] = funcprev - funci - lambdaprev * slopei[0];
				mmult(temp1,temp2,ab,2,2,1);
				scale(ab,1,2,1.0/ll);
				if (ab[0] == 0.0) {
					lambdatemp = - slopei[0] / (2.0 * ab[1]);
				} else {
					lambdatemp = (-ab[1] + sqrt( ab[1] * ab[1] - 3.0 * ab[0] *slopei[0]))/ (3.0 * ab[0]);
				}
				if (lambdatemp > 0.5 * lambda) {
					lambdatemp = 0.5 * lambda;
				}
			}
			lambdaprev = lambda;
			funcprev = funcf;
			if (lambdatemp <= 0.1 * lambda) {
				lambda = 0.1 * lambda;
			} else {
				lambda = lambdatemp;
			}
		}
	
	}
	
	free(slopei);
	free(temp1);
	free(temp2);
	free(ab);
	free(rcheck);
	free(pl);
	free(slopen);
	return retval;
}